

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O0

genxStatus addAttribute(genxAttribute_conflict a,constUtf8 valuestr)

{
  int c_00;
  int iVar1;
  genxStatus gVar2;
  constUtf8 in_RSI;
  undefined8 *in_RDI;
  utf8 unaff_retaddr;
  genxNamespace in_stack_00000008;
  int c;
  genxWriter w;
  utf8 lastv;
  undefined4 in_stack_ffffffffffffffd0;
  genxWriter w_00;
  constUtf8 local_20;
  constUtf8 local_18;
  undefined8 *local_10;
  genxStatus local_4;
  
  w_00 = (genxWriter)*in_RDI;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_RSI != (constUtf8)0x0) {
    startCollect((collector *)(in_RDI + 3));
    local_20 = in_RSI;
    while (*local_18 != '\0') {
      c_00 = genxNextUnicodeChar(&local_18);
      if (c_00 == -1) {
        w_00->status = GENX_BAD_UTF8;
        return GENX_BAD_UTF8;
      }
      iVar1 = isXMLChar(w_00,c_00);
      if (iVar1 == 0) {
        w_00->status = GENX_NON_XML_CHARACTER;
        return GENX_NON_XML_CHARACTER;
      }
      switch(c_00) {
      case 9:
        if (*(int *)((long)local_10 + 0x24) <= *(int *)(local_10 + 4) + 5) {
          gVar2 = growCollector(w_00,(collector *)CONCAT44(c_00,in_stack_ffffffffffffffd0),0);
          w_00->status = gVar2;
          if (gVar2 != GENX_SUCCESS) {
            return w_00->status;
          }
        }
        strncpy((char *)(local_10[3] + (long)*(int *)(local_10 + 4)),"&#x9;",5);
        *(int *)(local_10 + 4) = *(int *)(local_10 + 4) + 5;
        break;
      case 10:
        if (*(int *)((long)local_10 + 0x24) <= *(int *)(local_10 + 4) + 5) {
          gVar2 = growCollector(w_00,(collector *)CONCAT44(c_00,in_stack_ffffffffffffffd0),0);
          w_00->status = gVar2;
          if (gVar2 != GENX_SUCCESS) {
            return w_00->status;
          }
        }
        strncpy((char *)(local_10[3] + (long)*(int *)(local_10 + 4)),"&#xA;",5);
        *(int *)(local_10 + 4) = *(int *)(local_10 + 4) + 5;
        break;
      default:
        if ((long)*(int *)((long)local_10 + 0x24) <=
            (long)(local_18 + ((long)*(int *)(local_10 + 4) - (long)local_20))) {
          gVar2 = growCollector(w_00,(collector *)CONCAT44(c_00,in_stack_ffffffffffffffd0),0);
          w_00->status = gVar2;
          if (gVar2 != GENX_SUCCESS) {
            return w_00->status;
          }
        }
        strncpy((char *)(local_10[3] + (long)*(int *)(local_10 + 4)),(char *)local_20,
                (long)local_18 - (long)local_20);
        *(int *)(local_10 + 4) = *(int *)(local_10 + 4) + ((int)local_18 - (int)local_20);
        break;
      case 0xd:
        if (*(int *)((long)local_10 + 0x24) <= *(int *)(local_10 + 4) + 5) {
          gVar2 = growCollector(w_00,(collector *)CONCAT44(c_00,in_stack_ffffffffffffffd0),0);
          w_00->status = gVar2;
          if (gVar2 != GENX_SUCCESS) {
            return w_00->status;
          }
        }
        strncpy((char *)(local_10[3] + (long)*(int *)(local_10 + 4)),"&#xD;",5);
        *(int *)(local_10 + 4) = *(int *)(local_10 + 4) + 5;
        break;
      case 0x22:
        if (*(int *)((long)local_10 + 0x24) <= *(int *)(local_10 + 4) + 6) {
          gVar2 = growCollector(w_00,(collector *)CONCAT44(c_00,in_stack_ffffffffffffffd0),0);
          w_00->status = gVar2;
          if (gVar2 != GENX_SUCCESS) {
            return w_00->status;
          }
        }
        strncpy((char *)(local_10[3] + (long)*(int *)(local_10 + 4)),"&quot;",6);
        *(int *)(local_10 + 4) = *(int *)(local_10 + 4) + 6;
        break;
      case 0x26:
        if (*(int *)((long)local_10 + 0x24) <= *(int *)(local_10 + 4) + 5) {
          gVar2 = growCollector(w_00,(collector *)CONCAT44(c_00,in_stack_ffffffffffffffd0),0);
          w_00->status = gVar2;
          if (gVar2 != GENX_SUCCESS) {
            return w_00->status;
          }
        }
        strncpy((char *)(local_10[3] + (long)*(int *)(local_10 + 4)),"&amp;",5);
        *(int *)(local_10 + 4) = *(int *)(local_10 + 4) + 5;
        break;
      case 0x3c:
        if (*(int *)((long)local_10 + 0x24) <= *(int *)(local_10 + 4) + 4) {
          gVar2 = growCollector(w_00,(collector *)CONCAT44(c_00,in_stack_ffffffffffffffd0),0);
          w_00->status = gVar2;
          if (gVar2 != GENX_SUCCESS) {
            return w_00->status;
          }
        }
        strncpy((char *)(local_10[3] + (long)*(int *)(local_10 + 4)),"&lt;",4);
        *(int *)(local_10 + 4) = *(int *)(local_10 + 4) + 4;
      }
      local_20 = local_18;
    }
    endCollect((collector *)(local_10 + 3));
  }
  if (local_10[2] != 0) {
    addNamespace(in_stack_00000008,unaff_retaddr);
  }
  if ((local_18 == (constUtf8)0x0) || (*(int *)(local_10 + 5) == 0)) {
    *(undefined4 *)(local_10 + 5) = 1;
    local_4 = GENX_SUCCESS;
  }
  else {
    w_00->status = GENX_DUPLICATE_ATTRIBUTE;
    local_4 = GENX_DUPLICATE_ATTRIBUTE;
  }
  return local_4;
}

Assistant:

static genxStatus addAttribute(genxAttribute a, constUtf8 valuestr)
{
  utf8 lastv = (utf8) valuestr;
  genxWriter w = a->writer;

  /* if valuestr not provided, this is an xmlns with a pre-cooked value */
  if (valuestr)
  {
    startCollect(&a->value);
    while (*valuestr)
    {
      int c = genxNextUnicodeChar(&valuestr);
      
      if (c == -1)
	return w->status = GENX_BAD_UTF8;
      
      if (!isXMLChar(w, c))
	return w->status = GENX_NON_XML_CHARACTER;
      
      switch(c)
      {
      case 9:
	collectPiece(w, &a->value, "&#x9;", 5);
	break;
      case 0xa:
	collectPiece(w, &a->value, "&#xA;", 5); 
	break;
      case 0xd:
	collectPiece(w, &a->value, "&#xD;", 5); 
	break;
      case '"':
	collectPiece(w, &a->value, "&quot;", 6);
	break;
      case '<':
	collectPiece(w, &a->value, "&lt;", 4);
	break;
      case '&':
	collectPiece(w, &a->value, "&amp;", 5);
	break;
	/*
      case '>':
	collectPiece(w, &a->value, "&gt;", 4);
	break;
	*/
      default:
	collectPiece(w, &a->value, (const char *) lastv, valuestr - lastv);
	break;
      }
      lastv = (utf8) valuestr;
    }
    endCollect(&a->value);
  }

  /* now add the namespace attribute; might fail if it's bee hand-declared */
  if (a->ns)
    addNamespace(a->ns, NULL);

  if (valuestr && a->provided)
    return w->status = GENX_DUPLICATE_ATTRIBUTE;
  a->provided = 1;

  return GENX_SUCCESS;
}